

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int on_copy_ticket(ptls_encrypt_ticket_t *self,ptls_t *tls,int is_encrypt,ptls_buffer_t *dst,
                  ptls_iovec_t src)

{
  int iVar1;
  size_t delta;
  
  delta = src.len;
  iVar1 = ptls_buffer_reserve_aligned(dst,delta,'\0');
  if (iVar1 == 0) {
    memcpy(dst->base + dst->off,src.base,delta);
    dst->off = dst->off + delta;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int on_copy_ticket(ptls_encrypt_ticket_t *self, ptls_t *tls, int is_encrypt, ptls_buffer_t *dst, ptls_iovec_t src)
{
    int ret;

    if ((ret = ptls_buffer_reserve(dst, src.len)) != 0)
        return ret;
    memcpy(dst->base + dst->off, src.base, src.len);
    dst->off += src.len;

    return 0;
}